

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue_to_string.c
# Opt level: O0

char * amqpvalue_to_string(AMQP_VALUE amqp_value)

{
  int iVar1;
  AMQP_VALUE pAVar2;
  LOGGER_LOG p_Var3;
  char *pcVar4;
  LOGGER_LOG l_60;
  LOGGER_LOG l_59;
  char *described_value_string;
  LOGGER_LOG l_58;
  LOGGER_LOG l_57;
  AMQP_VALUE described_value;
  LOGGER_LOG l_56;
  LOGGER_LOG l_55;
  LOGGER_LOG l_54;
  char *item_string_1;
  LOGGER_LOG l_53;
  AMQP_VALUE item_1;
  uint32_t i_3;
  LOGGER_LOG l_52;
  LOGGER_LOG l_51;
  LOGGER_LOG p_Stack_3a8;
  uint32_t count_2;
  LOGGER_LOG l_50;
  LOGGER_LOG l_49;
  LOGGER_LOG l_48;
  char *value_string;
  LOGGER_LOG l_47;
  char *key_string;
  LOGGER_LOG l_46;
  AMQP_VALUE value_10;
  AMQP_VALUE key;
  LOGGER_LOG p_Stack_358;
  uint32_t i_2;
  LOGGER_LOG l_45;
  LOGGER_LOG l_44;
  LOGGER_LOG p_Stack_340;
  uint32_t count_1;
  LOGGER_LOG l_43;
  LOGGER_LOG l_42;
  LOGGER_LOG l_41;
  char *item_string;
  LOGGER_LOG l_40;
  AMQP_VALUE item;
  size_t i_1;
  LOGGER_LOG l_39;
  LOGGER_LOG l_38;
  LOGGER_LOG p_Stack_2f0;
  uint32_t count;
  LOGGER_LOG l_37;
  LOGGER_LOG l_36;
  char *string_value_1;
  LOGGER_LOG l_35;
  LOGGER_LOG l_34;
  char *string_value;
  LOGGER_LOG l_33;
  ulong uStack_2b0;
  char str_value_12 [4];
  uint64_t i;
  LOGGER_LOG l_32;
  LOGGER_LOG l_31;
  amqp_binary binary_value;
  LOGGER_LOG l_30;
  LOGGER_LOG l_29;
  char *uuid_string_value;
  LOGGER_LOG l_28;
  uuid uuid_value;
  LOGGER_LOG l_27;
  LOGGER_LOG l_26;
  int64_t value_9;
  char str_value_11 [21];
  LOGGER_LOG l_25;
  char str_value_10 [25];
  LOGGER_LOG l_24;
  LOGGER_LOG p_Stack_1e0;
  uint32_t char_code;
  LOGGER_LOG l_23;
  char str_value_9 [25];
  LOGGER_LOG l_22;
  double double_value;
  LOGGER_LOG l_21;
  char str_value_8 [25];
  LOGGER_LOG l_20;
  LOGGER_LOG p_Stack_160;
  float float_value;
  LOGGER_LOG l_19;
  LOGGER_LOG l_18;
  int64_t value_8;
  char str_value_7 [21];
  LOGGER_LOG l_17;
  LOGGER_LOG l_16;
  int32_t value_7;
  char str_value_6 [12];
  LOGGER_LOG l_15;
  LOGGER_LOG l_14;
  char local_ef [5];
  int16_t value_6;
  LOGGER_LOG p_Stack_e8;
  char str_value_5 [7];
  LOGGER_LOG l_13;
  LOGGER_LOG l_12;
  char value_5;
  LOGGER_LOG p_Stack_d0;
  char str_value_4 [5];
  LOGGER_LOG l_11;
  LOGGER_LOG l_10;
  uint64_t value_4;
  char str_value_3 [21];
  LOGGER_LOG l_9;
  LOGGER_LOG l_8;
  uint32_t value_3;
  char str_value_2 [11];
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  uint16_t value_2;
  char str_value_1 [6];
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  uint8_t value_1;
  LOGGER_LOG p_Stack_48;
  char str_value [4];
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG p_Stack_30;
  _Bool value;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  char *pcStack_18;
  AMQP_TYPE amqp_type;
  char *result;
  AMQP_VALUE amqp_value_local;
  
  pcStack_18 = (char *)0x0;
  if (amqp_value != (AMQP_VALUE)0x0) {
    result = (char *)amqp_value;
    l._4_4_ = amqpvalue_get_type(amqp_value);
    switch(l._4_4_) {
    case AMQP_TYPE_NULL:
      iVar1 = string_concat(&stack0xffffffffffffffe8,"NULL");
      if (iVar1 != 0) {
        p_Stack_30 = xlogging_get_log_function();
        if (p_Stack_30 != (LOGGER_LOG)0x0) {
          (*p_Stack_30)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                        ,"amqpvalue_to_string",0x49,1,"Failure building amqp value string");
        }
        free(pcStack_18);
        pcStack_18 = (char *)0x0;
      }
      break;
    case AMQP_TYPE_BOOL:
      iVar1 = amqpvalue_get_boolean((AMQP_VALUE)result,(_Bool *)((long)&l_2 + 7));
      if (iVar1 == 0) {
        pcVar4 = "false";
        if ((l_2._7_1_ & 1) == 1) {
          pcVar4 = "true";
        }
        iVar1 = string_concat(&stack0xffffffffffffffe8,pcVar4);
        if (iVar1 != 0) {
          p_Stack_48 = xlogging_get_log_function();
          if (p_Stack_48 != (LOGGER_LOG)0x0) {
            (*p_Stack_48)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                          ,"amqpvalue_to_string",0x59,1,"Failure building amqp value string");
          }
          free(pcStack_18);
          pcStack_18 = (char *)0x0;
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                    ,"amqpvalue_to_string",0x53,1,"Failure getting bool value");
        }
        free(pcStack_18);
        pcStack_18 = (char *)0x0;
      }
      break;
    case AMQP_TYPE_UBYTE:
      iVar1 = amqpvalue_get_ubyte((AMQP_VALUE)result,(uchar *)((long)&l_4 + 3));
      if (iVar1 == 0) {
        iVar1 = sprintf((char *)((long)&l_4 + 4),"%u",(ulong)l_4._3_1_);
        if ((iVar1 < 0) ||
           (iVar1 = string_concat(&stack0xffffffffffffffe8,(char *)((long)&l_4 + 4)), iVar1 != 0)) {
          _value_2 = xlogging_get_log_function();
          if (_value_2 != (LOGGER_LOG)0x0) {
            (*_value_2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                        ,"amqpvalue_to_string",0x6c,1,"Failure building amqp value string");
          }
          free(pcStack_18);
          pcStack_18 = (char *)0x0;
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                    ,"amqpvalue_to_string",0x65,1,"Failure getting ubyte value");
        }
        free(pcStack_18);
        pcStack_18 = (char *)0x0;
      }
      break;
    case AMQP_TYPE_USHORT:
      iVar1 = amqpvalue_get_ushort((AMQP_VALUE)result,(uint16_t *)&l_6);
      if (iVar1 == 0) {
        iVar1 = sprintf((char *)((long)&l_6 + 2),"%u",(ulong)(ushort)l_6);
        if ((iVar1 < 0) ||
           (iVar1 = string_concat(&stack0xffffffffffffffe8,(char *)((long)&l_6 + 2)), iVar1 != 0)) {
          str_value_2._3_8_ = xlogging_get_log_function();
          if ((LOGGER_LOG)str_value_2._3_8_ != (LOGGER_LOG)0x0) {
            (*(code *)str_value_2._3_8_)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                       ,"amqpvalue_to_string",0x7f,1,"Failure building amqp value string");
          }
          free(pcStack_18);
          pcStack_18 = (char *)0x0;
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                    ,"amqpvalue_to_string",0x78,1,"Failure getting ushort value");
        }
        free(pcStack_18);
        pcStack_18 = (char *)0x0;
      }
      break;
    case AMQP_TYPE_UINT:
      iVar1 = amqpvalue_get_uint((AMQP_VALUE)result,(uint32_t *)&l_8);
      if (iVar1 == 0) {
        iVar1 = sprintf((char *)((long)&l_8 + 5),"%u",(ulong)(uint)l_8);
        if ((iVar1 < 0) ||
           (iVar1 = string_concat(&stack0xffffffffffffffe8,(char *)((long)&l_8 + 5)), iVar1 != 0)) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                      ,"amqpvalue_to_string",0x92,1,"Failure building amqp value string");
          }
          free(pcStack_18);
          pcStack_18 = (char *)0x0;
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                    ,"amqpvalue_to_string",0x8b,1,"Failure getting uint value");
        }
        free(pcStack_18);
        pcStack_18 = (char *)0x0;
      }
      break;
    case AMQP_TYPE_ULONG:
      iVar1 = amqpvalue_get_ulong((AMQP_VALUE)result,(uint64_t *)&l_10);
      if (iVar1 == 0) {
        iVar1 = sprintf((char *)&value_4,"%lu",l_10);
        if ((iVar1 < 0) ||
           (iVar1 = string_concat(&stack0xffffffffffffffe8,(char *)&value_4), iVar1 != 0)) {
          p_Stack_d0 = xlogging_get_log_function();
          if (p_Stack_d0 != (LOGGER_LOG)0x0) {
            (*p_Stack_d0)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                          ,"amqpvalue_to_string",0xa5,1,"Failure building amqp value string");
          }
          free(pcStack_18);
          pcStack_18 = (char *)0x0;
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                    ,"amqpvalue_to_string",0x9e,1,"Failure getting ulong value");
        }
        free(pcStack_18);
        pcStack_18 = (char *)0x0;
      }
      break;
    case AMQP_TYPE_BYTE:
      iVar1 = amqpvalue_get_byte((AMQP_VALUE)result,(char *)((long)&l_12 + 2));
      if (iVar1 == 0) {
        iVar1 = sprintf((char *)((long)&l_12 + 3),"%d",(ulong)(uint)(int)l_12._2_1_);
        if ((iVar1 < 0) ||
           (iVar1 = string_concat(&stack0xffffffffffffffe8,(char *)((long)&l_12 + 3)), iVar1 != 0))
        {
          p_Stack_e8 = xlogging_get_log_function();
          if (p_Stack_e8 != (LOGGER_LOG)0x0) {
            (*p_Stack_e8)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                          ,"amqpvalue_to_string",0xb8,1,"Failure building amqp value string");
          }
          free(pcStack_18);
          pcStack_18 = (char *)0x0;
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                    ,"amqpvalue_to_string",0xb1,1,"Failure getting byte value");
        }
        free(pcStack_18);
        pcStack_18 = (char *)0x0;
      }
      break;
    case AMQP_TYPE_SHORT:
      iVar1 = amqpvalue_get_short((AMQP_VALUE)result,(int16_t *)((long)&l_14 + 6));
      if (iVar1 == 0) {
        iVar1 = sprintf(local_ef,"%d",(ulong)(uint)(int)l_14._6_2_);
        if ((iVar1 < 0) || (iVar1 = string_concat(&stack0xffffffffffffffe8,local_ef), iVar1 != 0)) {
          str_value_6._4_8_ = xlogging_get_log_function();
          if ((LOGGER_LOG)str_value_6._4_8_ != (LOGGER_LOG)0x0) {
            (*(code *)str_value_6._4_8_)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                       ,"amqpvalue_to_string",0xcb,1,"Failure building amqp value string");
          }
          free(pcStack_18);
          pcStack_18 = (char *)0x0;
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                    ,"amqpvalue_to_string",0xc4,1,"Failure getting short value");
        }
        free(pcStack_18);
        pcStack_18 = (char *)0x0;
      }
      break;
    case AMQP_TYPE_INT:
      iVar1 = amqpvalue_get_int((AMQP_VALUE)result,(int32_t *)&l_16);
      if (iVar1 == 0) {
        iVar1 = sprintf((char *)((long)&l_16 + 4),"%d",(ulong)(uint)l_16);
        if ((iVar1 < 0) ||
           (iVar1 = string_concat(&stack0xffffffffffffffe8,(char *)((long)&l_16 + 4)), iVar1 != 0))
        {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                      ,"amqpvalue_to_string",0xde,1,"Failure building amqp value string");
          }
          free(pcStack_18);
          pcStack_18 = (char *)0x0;
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                    ,"amqpvalue_to_string",0xd7,1,"Failure getting int value");
        }
        free(pcStack_18);
        pcStack_18 = (char *)0x0;
      }
      break;
    case AMQP_TYPE_LONG:
      iVar1 = amqpvalue_get_long((AMQP_VALUE)result,(int64_t *)&l_18);
      if (iVar1 == 0) {
        iVar1 = sprintf((char *)&value_8,"%ld",l_18);
        if ((iVar1 < 0) ||
           (iVar1 = string_concat(&stack0xffffffffffffffe8,(char *)&value_8), iVar1 != 0)) {
          p_Stack_160 = xlogging_get_log_function();
          if (p_Stack_160 != (LOGGER_LOG)0x0) {
            (*p_Stack_160)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                           ,"amqpvalue_to_string",0xf1,1,"Failure building amqp value string");
          }
          free(pcStack_18);
          pcStack_18 = (char *)0x0;
        }
      }
      else {
        l_19 = xlogging_get_log_function();
        if (l_19 != (LOGGER_LOG)0x0) {
          (*l_19)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                  ,"amqpvalue_to_string",0xea,1,"Failure getting long value");
        }
        free(pcStack_18);
        pcStack_18 = (char *)0x0;
      }
      break;
    case AMQP_TYPE_FLOAT:
      iVar1 = amqpvalue_get_float((AMQP_VALUE)result,(float *)((long)&l_20 + 4));
      if (iVar1 == 0) {
        iVar1 = snprintf((char *)&l_21,0x19,"%.02f",(double)l_20._4_4_);
        if ((iVar1 < 0) ||
           (iVar1 = string_concat(&stack0xffffffffffffffe8,(char *)&l_21), iVar1 != 0)) {
          double_value = (double)xlogging_get_log_function();
          if ((LOGGER_LOG)double_value != (LOGGER_LOG)0x0) {
            (*(code *)double_value)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                       ,"amqpvalue_to_string",0x106,1,"Failure building amqp value string");
          }
          free(pcStack_18);
          pcStack_18 = (char *)0x0;
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                    ,"amqpvalue_to_string",0xfc,1,"Failure getting float value");
        }
        free(pcStack_18);
        pcStack_18 = (char *)0x0;
      }
      break;
    case AMQP_TYPE_DOUBLE:
      iVar1 = amqpvalue_get_double((AMQP_VALUE)result,(double *)&l_22);
      if (iVar1 == 0) {
        iVar1 = snprintf((char *)&l_23,0x19,"%.02lf",l_22);
        if ((iVar1 < 0) ||
           (iVar1 = string_concat(&stack0xffffffffffffffe8,(char *)&l_23), iVar1 != 0)) {
          p_Stack_1e0 = xlogging_get_log_function();
          if (p_Stack_1e0 != (LOGGER_LOG)0x0) {
            (*p_Stack_1e0)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                           ,"amqpvalue_to_string",0x11c,1,"Failure building amqp value string");
          }
          free(pcStack_18);
          pcStack_18 = (char *)0x0;
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                    ,"amqpvalue_to_string",0x112,1,"Failure getting double value");
        }
        free(pcStack_18);
        pcStack_18 = (char *)0x0;
      }
      break;
    case AMQP_TYPE_CHAR:
      iVar1 = amqpvalue_get_char((AMQP_VALUE)result,(uint32_t *)((long)&l_24 + 4));
      if (iVar1 == 0) {
        iVar1 = snprintf((char *)&l_25,0x19,"U%02X%02X%02X%02X",(ulong)(l_24._4_4_ >> 0x18),
                         (ulong)(l_24._4_4_ >> 0x10 & 0xff),(ulong)(l_24._4_4_ >> 8 & 0xff),
                         l_24._4_4_ & 0xff);
        if ((iVar1 < 0) ||
           (iVar1 = string_concat(&stack0xffffffffffffffe8,(char *)&l_25), iVar1 != 0)) {
          register0x00000000 = xlogging_get_log_function();
          if (register0x00000000 != (LOGGER_LOG)0x0) {
            (*register0x00000000)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                       ,"amqpvalue_to_string",0x132,1,"Failure building amqp value string");
          }
          free(pcStack_18);
          pcStack_18 = (char *)0x0;
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                    ,"amqpvalue_to_string",0x128,1,"Failure getting char value");
        }
        free(pcStack_18);
        pcStack_18 = (char *)0x0;
      }
      break;
    case AMQP_TYPE_TIMESTAMP:
      iVar1 = amqpvalue_get_timestamp((AMQP_VALUE)result,(int64_t *)&l_26);
      if (iVar1 == 0) {
        iVar1 = sprintf((char *)&value_9,"%ld",l_26);
        if ((iVar1 < 0) ||
           (iVar1 = string_concat(&stack0xffffffffffffffe8,(char *)&value_9), iVar1 != 0)) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                      ,"amqpvalue_to_string",0x146,1,"Failure building amqp value string");
          }
          free(pcStack_18);
          pcStack_18 = (char *)0x0;
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                    ,"amqpvalue_to_string",0x13f,1,"Failure getting timestamp value");
        }
        free(pcStack_18);
        pcStack_18 = (char *)0x0;
      }
      break;
    case AMQP_TYPE_UUID:
      iVar1 = amqpvalue_get_uuid((AMQP_VALUE)result,(uuid *)&l_28);
      if (iVar1 == 0) {
        pcVar4 = UUID_to_string((UUID_T *)&l_28);
        if (pcVar4 == (char *)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                      ,"amqpvalue_to_string",0x15a,1,"Failure getting UUID stringified value");
          }
          free(pcStack_18);
          pcStack_18 = (char *)0x0;
        }
        else {
          iVar1 = string_concat(&stack0xffffffffffffffe8,pcVar4);
          if (iVar1 != 0) {
            binary_value._8_8_ = xlogging_get_log_function();
            if ((LOGGER_LOG)binary_value._8_8_ != (LOGGER_LOG)0x0) {
              (*(code *)binary_value._8_8_)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                         ,"amqpvalue_to_string",0x162,1,"Failure building amqp value string");
            }
            free(pcStack_18);
            pcStack_18 = (char *)0x0;
          }
          free(pcVar4);
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                    ,"amqpvalue_to_string",0x151,1,"Failure getting uuid value");
        }
        free(pcStack_18);
        pcStack_18 = (char *)0x0;
      }
      break;
    case AMQP_TYPE_BINARY:
      iVar1 = amqpvalue_get_binary((AMQP_VALUE)result,(amqp_binary *)&l_31);
      if (iVar1 == 0) {
        iVar1 = string_concat(&stack0xffffffffffffffe8,"<");
        if (iVar1 == 0) {
          for (uStack_2b0 = 0; uStack_2b0 < (uint)binary_value.bytes; uStack_2b0 = uStack_2b0 + 1) {
            pcVar4 = "";
            if (uStack_2b0 != 0) {
              pcVar4 = " ";
            }
            iVar1 = snprintf((char *)((long)&l_33 + 4),4,"%s%02X",pcVar4,
                             (ulong)(byte)l_31[uStack_2b0]);
            if ((iVar1 < 0) ||
               (iVar1 = string_concat(&stack0xffffffffffffffe8,(char *)((long)&l_33 + 4)),
               iVar1 != 0)) break;
          }
          if ((uStack_2b0 < (uint)binary_value.bytes) ||
             (iVar1 = string_concat(&stack0xffffffffffffffe8,">"), iVar1 != 0)) {
            string_value = (char *)xlogging_get_log_function();
            if ((LOGGER_LOG)string_value != (LOGGER_LOG)0x0) {
              (*(code *)string_value)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                         ,"amqpvalue_to_string",400,1,"Failure building amqp value string");
            }
            free(pcStack_18);
            pcStack_18 = (char *)0x0;
          }
        }
        else {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                      ,"amqpvalue_to_string",0x17b,1,"Failure building amqp value string");
          }
          free(pcStack_18);
          pcStack_18 = (char *)0x0;
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                    ,"amqpvalue_to_string",0x173,1,"Failure getting binary value");
        }
        free(pcStack_18);
        pcStack_18 = (char *)0x0;
      }
      break;
    case AMQP_TYPE_STRING:
      iVar1 = amqpvalue_get_string((AMQP_VALUE)result,(char **)&l_34);
      if (iVar1 == 0) {
        iVar1 = string_concat(&stack0xffffffffffffffe8,(char *)l_34);
        if (iVar1 != 0) {
          string_value_1 = (char *)xlogging_get_log_function();
          if ((LOGGER_LOG)string_value_1 != (LOGGER_LOG)0x0) {
            (*(code *)string_value_1)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                       ,"amqpvalue_to_string",0x1a5,1,"Failure building amqp value string");
          }
          free(pcStack_18);
          pcStack_18 = (char *)0x0;
        }
      }
      else {
        l_35 = xlogging_get_log_function();
        if (l_35 != (LOGGER_LOG)0x0) {
          (*l_35)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                  ,"amqpvalue_to_string",0x19d,1,"Failure getting string value");
        }
        free(pcStack_18);
        pcStack_18 = (char *)0x0;
      }
      break;
    case AMQP_TYPE_SYMBOL:
      iVar1 = amqpvalue_get_symbol((AMQP_VALUE)result,(char **)&l_36);
      if (iVar1 == 0) {
        iVar1 = string_concat(&stack0xffffffffffffffe8,(char *)l_36);
        if (iVar1 != 0) {
          p_Stack_2f0 = xlogging_get_log_function();
          if (p_Stack_2f0 != (LOGGER_LOG)0x0) {
            (*p_Stack_2f0)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                           ,"amqpvalue_to_string",0x1b9,1,"Failure building amqp value string");
          }
          free(pcStack_18);
          pcStack_18 = (char *)0x0;
        }
      }
      else {
        l_37 = xlogging_get_log_function();
        if (l_37 != (LOGGER_LOG)0x0) {
          (*l_37)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                  ,"amqpvalue_to_string",0x1b1,1,"Failure getting symbol value");
        }
        free(pcStack_18);
        pcStack_18 = (char *)0x0;
      }
      break;
    case AMQP_TYPE_LIST:
      iVar1 = amqpvalue_get_list_item_count((AMQP_VALUE)result,(uint32_t *)((long)&l_38 + 4));
      if (iVar1 == 0) {
        iVar1 = string_concat(&stack0xffffffffffffffe8,"{");
        if (iVar1 == 0) {
          for (item = (AMQP_VALUE)0x0; item < (AMQP_VALUE)(ulong)l_38._4_4_;
              item = (AMQP_VALUE)((long)&item->type + 1)) {
            l_40 = (LOGGER_LOG)amqpvalue_get_list_item((AMQP_VALUE)result,(size_t)item);
            if ((AMQP_VALUE)l_40 == (AMQP_VALUE)0x0) {
              item_string = (char *)xlogging_get_log_function();
              if ((LOGGER_LOG)item_string != (LOGGER_LOG)0x0) {
                (*(code *)item_string)
                          (AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                           ,"amqpvalue_to_string",0x1d7,1,"Failure getting item %u from list",
                           (int)item);
              }
              break;
            }
            l_41 = (LOGGER_LOG)amqpvalue_to_string((AMQP_VALUE)l_40);
            if (l_41 == (LOGGER_LOG)0x0) {
              l_42 = xlogging_get_log_function();
              if (l_42 != (LOGGER_LOG)0x0) {
                (*l_42)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                        ,"amqpvalue_to_string",0x1df,1,"Failure converting item %u to string",
                        (int)item);
              }
              amqpvalue_destroy((AMQP_VALUE)l_40);
              break;
            }
            if (((item != (AMQP_VALUE)0x0) &&
                (iVar1 = string_concat(&stack0xffffffffffffffe8,","), iVar1 != 0)) ||
               (iVar1 = string_concat(&stack0xffffffffffffffe8,(char *)l_41), iVar1 != 0)) {
              l_43 = xlogging_get_log_function();
              if (l_43 != (LOGGER_LOG)0x0) {
                (*l_43)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                        ,"amqpvalue_to_string",0x1e8,1,"Failure building amqp value string");
              }
              free(pcStack_18);
              pcStack_18 = (char *)0x0;
              break;
            }
            free(l_41);
            amqpvalue_destroy((AMQP_VALUE)l_40);
          }
          if (item < (AMQP_VALUE)(ulong)l_38._4_4_) {
            free(pcStack_18);
            pcStack_18 = (char *)0x0;
          }
          else {
            iVar1 = string_concat(&stack0xffffffffffffffe8,"}");
            if (iVar1 != 0) {
              p_Stack_340 = xlogging_get_log_function();
              if (p_Stack_340 != (LOGGER_LOG)0x0) {
                (*p_Stack_340)(AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                               ,"amqpvalue_to_string",0x1fd,1,"Failure building amqp value string");
              }
              free(pcStack_18);
              pcStack_18 = (char *)0x0;
            }
          }
        }
        else {
          i_1 = (size_t)xlogging_get_log_function();
          if ((LOGGER_LOG)i_1 != (LOGGER_LOG)0x0) {
            (*(code *)i_1)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                           ,"amqpvalue_to_string",0x1cb,1,"Failure building amqp value string");
          }
          free(pcStack_18);
          pcStack_18 = (char *)0x0;
        }
      }
      else {
        l_39 = xlogging_get_log_function();
        if (l_39 != (LOGGER_LOG)0x0) {
          (*l_39)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                  ,"amqpvalue_to_string",0x1c5,1,"Failure getting list item count value");
        }
        free(pcStack_18);
        pcStack_18 = (char *)0x0;
      }
      break;
    case AMQP_TYPE_MAP:
      iVar1 = amqpvalue_get_map_pair_count((AMQP_VALUE)result,(uint32_t *)((long)&l_44 + 4));
      if (iVar1 == 0) {
        iVar1 = string_concat(&stack0xffffffffffffffe8,"{");
        if (iVar1 == 0) {
          for (key._4_4_ = 0; key._4_4_ < l_44._4_4_; key._4_4_ = key._4_4_ + 1) {
            iVar1 = amqpvalue_get_map_key_value_pair
                              ((AMQP_VALUE)result,key._4_4_,&value_10,(AMQP_VALUE *)&l_46);
            if (iVar1 != 0) {
              key_string = (char *)xlogging_get_log_function();
              if ((LOGGER_LOG)key_string != (LOGGER_LOG)0x0) {
                (*(code *)key_string)
                          (AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                           ,"amqpvalue_to_string",0x21c,1,"Failure getting key/value pair index %u",
                           key._4_4_);
              }
              break;
            }
            l_47 = (LOGGER_LOG)amqpvalue_to_string(value_10);
            if (l_47 == (LOGGER_LOG)0x0) {
              value_string = (char *)xlogging_get_log_function();
              if ((LOGGER_LOG)value_string != (LOGGER_LOG)0x0) {
                (*(code *)value_string)
                          (AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                           ,"amqpvalue_to_string",0x224,1,
                           "Failure getting stringified key value for index %u",key._4_4_);
              }
              amqpvalue_destroy(value_10);
              amqpvalue_destroy((AMQP_VALUE)l_46);
              break;
            }
            l_48 = (LOGGER_LOG)amqpvalue_to_string((AMQP_VALUE)l_46);
            if (l_48 == (LOGGER_LOG)0x0) {
              l_49 = xlogging_get_log_function();
              if (l_49 != (LOGGER_LOG)0x0) {
                (*l_49)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                        ,"amqpvalue_to_string",0x22e,1,
                        "Failure getting stringified value for index %u",key._4_4_);
              }
              free(l_47);
              amqpvalue_destroy(value_10);
              amqpvalue_destroy((AMQP_VALUE)l_46);
              break;
            }
            if (((((key._4_4_ != 0) &&
                  (iVar1 = string_concat(&stack0xffffffffffffffe8,","), iVar1 != 0)) ||
                 ((iVar1 = string_concat(&stack0xffffffffffffffe8,"["), iVar1 != 0 ||
                  ((iVar1 = string_concat(&stack0xffffffffffffffe8,(char *)l_47), iVar1 != 0 ||
                   (iVar1 = string_concat(&stack0xffffffffffffffe8,":"), iVar1 != 0)))))) ||
                (iVar1 = string_concat(&stack0xffffffffffffffe8,(char *)l_48), iVar1 != 0)) ||
               (iVar1 = string_concat(&stack0xffffffffffffffe8,"]"), iVar1 != 0)) {
              l_50 = xlogging_get_log_function();
              if (l_50 != (LOGGER_LOG)0x0) {
                (*l_50)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                        ,"amqpvalue_to_string",0x23d,1,"Failure building amqp value string");
              }
              free(l_47);
              free(l_48);
              amqpvalue_destroy(value_10);
              amqpvalue_destroy((AMQP_VALUE)l_46);
              break;
            }
            free(l_48);
            free(l_47);
            amqpvalue_destroy(value_10);
            amqpvalue_destroy((AMQP_VALUE)l_46);
          }
          if (key._4_4_ < l_44._4_4_) {
            free(pcStack_18);
            pcStack_18 = (char *)0x0;
          }
          else {
            iVar1 = string_concat(&stack0xffffffffffffffe8,"}");
            if (iVar1 != 0) {
              p_Stack_3a8 = xlogging_get_log_function();
              if (p_Stack_3a8 != (LOGGER_LOG)0x0) {
                (*p_Stack_3a8)(AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                               ,"amqpvalue_to_string",600,1,"Failure building amqp value string");
              }
              free(pcStack_18);
              pcStack_18 = (char *)0x0;
            }
          }
        }
        else {
          p_Stack_358 = xlogging_get_log_function();
          if (p_Stack_358 != (LOGGER_LOG)0x0) {
            (*p_Stack_358)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                           ,"amqpvalue_to_string",0x20f,1,"Failure building amqp value string");
          }
          free(pcStack_18);
          pcStack_18 = (char *)0x0;
        }
      }
      else {
        l_45 = xlogging_get_log_function();
        if (l_45 != (LOGGER_LOG)0x0) {
          (*l_45)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                  ,"amqpvalue_to_string",0x209,1,"Failure getting map pair count");
        }
        free(pcStack_18);
        pcStack_18 = (char *)0x0;
      }
      break;
    case AMQP_TYPE_ARRAY:
      iVar1 = amqpvalue_get_array_item_count((AMQP_VALUE)result,(uint32_t *)((long)&l_51 + 4));
      if (iVar1 == 0) {
        iVar1 = string_concat(&stack0xffffffffffffffe8,"{");
        if (iVar1 == 0) {
          for (item_1._4_4_ = 0; item_1._4_4_ < l_51._4_4_; item_1._4_4_ = item_1._4_4_ + 1) {
            pAVar2 = amqpvalue_get_array_item((AMQP_VALUE)result,item_1._4_4_);
            if (pAVar2 == (AMQP_VALUE)0x0) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                          ,"amqpvalue_to_string",0x276,1,"Failure getting array item for index %u",
                          item_1._4_4_);
              }
              break;
            }
            pcVar4 = amqpvalue_to_string(pAVar2);
            if (pcVar4 == (char *)0x0) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                          ,"amqpvalue_to_string",0x27e,1,
                          "Failure getting stringified array item value for index %u",item_1._4_4_);
              }
              amqpvalue_destroy(pAVar2);
              break;
            }
            if (((item_1._4_4_ != 0) &&
                (iVar1 = string_concat(&stack0xffffffffffffffe8,","), iVar1 != 0)) ||
               (iVar1 = string_concat(&stack0xffffffffffffffe8,pcVar4), iVar1 != 0)) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                          ,"amqpvalue_to_string",0x287,1,"Failure building amqp value string");
              }
              free(pcStack_18);
              pcStack_18 = (char *)0x0;
              break;
            }
            free(pcVar4);
            amqpvalue_destroy(pAVar2);
          }
          if (item_1._4_4_ < l_51._4_4_) {
            free(pcStack_18);
            pcStack_18 = (char *)0x0;
          }
          else {
            iVar1 = string_concat(&stack0xffffffffffffffe8,"}");
            if (iVar1 != 0) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                          ,"amqpvalue_to_string",0x29c,1,"Failure building amqp value string");
              }
              free(pcStack_18);
              pcStack_18 = (char *)0x0;
            }
          }
        }
        else {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                      ,"amqpvalue_to_string",0x26a,1,"Failure building amqp value string");
          }
          free(pcStack_18);
          pcStack_18 = (char *)0x0;
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                    ,"amqpvalue_to_string",0x264,1,"Failure getting array item count");
        }
        free(pcStack_18);
        pcStack_18 = (char *)0x0;
      }
      break;
    case AMQP_TYPE_DESCRIBED:
    case AMQP_TYPE_COMPOSITE:
      pAVar2 = amqpvalue_get_inplace_described_value((AMQP_VALUE)result);
      if (pAVar2 == (AMQP_VALUE)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                    ,"amqpvalue_to_string",0x2a9,1,"Failure getting described value");
        }
        free(pcStack_18);
        pcStack_18 = (char *)0x0;
      }
      else {
        iVar1 = string_concat(&stack0xffffffffffffffe8,"* ");
        if (iVar1 == 0) {
          pcVar4 = amqpvalue_to_string(pAVar2);
          if (pcVar4 == (char *)0x0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                        ,"amqpvalue_to_string",0x2ba,1,"Failure getting stringified described value"
                       );
            }
            free(pcStack_18);
            pcStack_18 = (char *)0x0;
          }
          else {
            iVar1 = string_concat(&stack0xffffffffffffffe8,pcVar4);
            if (iVar1 != 0) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                          ,"amqpvalue_to_string",0x2c2,1,"Failure building amqp value string");
              }
              free(pcStack_18);
              pcStack_18 = (char *)0x0;
            }
            free(pcVar4);
          }
        }
        else {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
                      ,"amqpvalue_to_string",0x2b1,1,"Failure building amqp value string");
          }
          free(pcStack_18);
          pcStack_18 = (char *)0x0;
        }
      }
      break;
    default:
      l_1 = xlogging_get_log_function();
      if (l_1 != (LOGGER_LOG)0x0) {
        (*l_1)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
               ,"amqpvalue_to_string",0x42,1,"Unknown AMQP type");
      }
      pcStack_18 = (char *)0x0;
    }
  }
  return pcStack_18;
}

Assistant:

char* amqpvalue_to_string(AMQP_VALUE amqp_value)
{
    char* result = NULL;

    if (amqp_value != NULL)
    {
        AMQP_TYPE amqp_type = amqpvalue_get_type(amqp_value);
        switch (amqp_type)
        {
        default:
            LogError("Unknown AMQP type");
            result = NULL;
            break;

        case AMQP_TYPE_NULL:
            if (string_concat(&result, "NULL") != 0)
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            break;
        case AMQP_TYPE_BOOL:
        {
            bool value;
            if (amqpvalue_get_boolean(amqp_value, &value) != 0)
            {
                LogError("Failure getting bool value");
                free(result);
                result = NULL;
            }
            else if (string_concat(&result, (value == true) ? "true" : "false") != 0)
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            break;
        }
        case AMQP_TYPE_UBYTE:
        {
            char str_value[4];
            uint8_t value;
            if (amqpvalue_get_ubyte(amqp_value, &value) != 0)
            {
                LogError("Failure getting ubyte value");
                free(result);
                result = NULL;
            }
            else if ((sprintf(str_value, "%" PRIu8, value) < 0) ||
                     (string_concat(&result, str_value) != 0))
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            break;
        }
        case AMQP_TYPE_USHORT:
        {
            char str_value[6];
            uint16_t value;
            if (amqpvalue_get_ushort(amqp_value, &value) != 0)
            {
                LogError("Failure getting ushort value");
                free(result);
                result = NULL;
            }
            else if ((sprintf(str_value, "%" PRIu16, value) < 0) ||
                     (string_concat(&result, str_value) != 0))
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            break;
        }
        case AMQP_TYPE_UINT:
        {
            char str_value[11];
            uint32_t value;
            if (amqpvalue_get_uint(amqp_value, &value) != 0)
            {
                LogError("Failure getting uint value");
                free(result);
                result = NULL;
            }
            else if ((sprintf(str_value, "%" PRIu32, value) < 0) ||
                     (string_concat(&result, str_value) != 0))
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            break;
        }
        case AMQP_TYPE_ULONG:
        {
            char str_value[21];
            uint64_t value;
            if (amqpvalue_get_ulong(amqp_value, &value) != 0)
            {
                LogError("Failure getting ulong value");
                free(result);
                result = NULL;
            }
            else if ((sprintf(str_value, "%" PRIu64, value) < 0) ||
                     (string_concat(&result, str_value) != 0))
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            break;
        }
        case AMQP_TYPE_BYTE:
        {
            char str_value[5];
            char value;
            if (amqpvalue_get_byte(amqp_value, &value) != 0)
            {
                LogError("Failure getting byte value");
                free(result);
                result = NULL;
            }
            else if ((sprintf(str_value, "%" PRId8, value) < 0) ||
                     (string_concat(&result, str_value) != 0))
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            break;
        }
        case AMQP_TYPE_SHORT:
        {
            char str_value[7];
            int16_t value;
            if (amqpvalue_get_short(amqp_value, &value) != 0)
            {
                LogError("Failure getting short value");
                free(result);
                result = NULL;
            }
            else if ((sprintf(str_value, "%" PRId16, value) < 0) ||
                     (string_concat(&result, str_value) != 0))
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            break;
        }
        case AMQP_TYPE_INT:
        {
            char str_value[12];
            int32_t value;
            if (amqpvalue_get_int(amqp_value, &value) != 0)
            {
                LogError("Failure getting int value");
                free(result);
                result = NULL;
            }
            else if ((sprintf(str_value, "%" PRId32, value) < 0) ||
                     (string_concat(&result, str_value) != 0))
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            break;
        }
        case AMQP_TYPE_LONG:
        {
            char str_value[21];
            int64_t value;
            if (amqpvalue_get_long(amqp_value, &value) != 0)
            {
                LogError("Failure getting long value");
                free(result);
                result = NULL;
            }
            else if ((sprintf(str_value, "%" PRId64, value) < 0) ||
                     (string_concat(&result, str_value) != 0))
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            break;
        }
        case AMQP_TYPE_FLOAT:
        {
            float float_value;
            if (amqpvalue_get_float(amqp_value, &float_value) != 0)
            {
                LogError("Failure getting float value");
                free(result);
                result = NULL;
            }
            else
            {
                char str_value[25];
                if ((snprintf(str_value, sizeof(str_value), "%.02f", float_value) < 0) ||
                    (string_concat(&result, str_value) != 0))
                {
                    LogError("Failure building amqp value string");
                    free(result);
                    result = NULL;
                }
            }
            break;
        }
        case AMQP_TYPE_DOUBLE:
        {
            double double_value;
            if (amqpvalue_get_double(amqp_value, &double_value) != 0)
            {
                LogError("Failure getting double value");
                free(result);
                result = NULL;
            }
            else
            {
                char str_value[25];
                if ((snprintf(str_value, sizeof(str_value), "%.02lf", double_value) < 0) ||
                    (string_concat(&result, str_value) != 0))
                {
                    LogError("Failure building amqp value string");
                    free(result);
                    result = NULL;
                }
            }
            break;
        }
        case AMQP_TYPE_CHAR:
        {
            uint32_t char_code;
            if (amqpvalue_get_char(amqp_value, &char_code) != 0)
            {
                LogError("Failure getting char value");
                free(result);
                result = NULL;
            }
            else
            {
                char str_value[25];
                if ((snprintf(str_value, sizeof(str_value), "U%02X%02X%02X%02X", char_code >> 24, (char_code >> 16) & 0xFF, (char_code >> 8) & 0xFF, char_code & 0xFF) < 0) ||
                    (string_concat(&result, str_value) != 0))
                {
                    LogError("Failure building amqp value string");
                    free(result);
                    result = NULL;
                }
            }
            break;
        }
        case AMQP_TYPE_TIMESTAMP:
        {
            char str_value[21];
            int64_t value;
            if (amqpvalue_get_timestamp(amqp_value, &value) != 0)
            {
                LogError("Failure getting timestamp value");
                free(result);
                result = NULL;
            }
            else if ((sprintf(str_value, "%" PRId64, value) < 0) ||
                     (string_concat(&result, str_value) != 0))
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            break;
        }
        case AMQP_TYPE_UUID:
        {
            uuid uuid_value;
            if (amqpvalue_get_uuid(amqp_value, &uuid_value) != 0)
            {
                LogError("Failure getting uuid value");
                free(result);
                result = NULL;
            }
            else
            {
                char* uuid_string_value = UUID_to_string((const UUID_T *)&uuid_value);
                if (uuid_string_value == NULL)
                {
                    LogError("Failure getting UUID stringified value");
                    free(result);
                    result = NULL;
                }
                else
                {
                    if (string_concat(&result, uuid_string_value) != 0)
                    {
                        LogError("Failure building amqp value string");
                        free(result);
                        result = NULL;
                    }

                    free(uuid_string_value);
                }
            }

            break;
        }

        case AMQP_TYPE_BINARY:
        {
            amqp_binary binary_value;
            if (amqpvalue_get_binary(amqp_value, &binary_value) != 0)
            {
                LogError("Failure getting binary value");
                free(result);
                result = NULL;
            }
            else
            {
                if (string_concat(&result, "<") != 0)
                {
                    LogError("Failure building amqp value string");
                    free(result);
                    result = NULL;
                }
                else
                {
                    uint64_t i;

                    for (i = 0; i < binary_value.length; i++)
                    {
                        char str_value[4];
                        if ((snprintf(str_value, sizeof(str_value), "%s%02X", (i > 0) ? " " : "", ((unsigned char*)binary_value.bytes)[i]) < 0) ||
                            (string_concat(&result, str_value) != 0))
                        {
                            break;
                        }
                    }

                    if ((i < binary_value.length) ||
                        (string_concat(&result, ">") != 0))
                    {
                        LogError("Failure building amqp value string");
                        free(result);
                        result = NULL;
                    }
                }
            }
            break;
        }
        case AMQP_TYPE_STRING:
        {
            const char* string_value;
            if (amqpvalue_get_string(amqp_value, &string_value) != 0)
            {
                LogError("Failure getting string value");
                free(result);
                result = NULL;
            }
            else
            {
                if (string_concat(&result, string_value) != 0)
                {
                    LogError("Failure building amqp value string");
                    free(result);
                    result = NULL;
                }
            }
            break;
        }
        case AMQP_TYPE_SYMBOL:
        {
            const char* string_value;
            if (amqpvalue_get_symbol(amqp_value, &string_value) != 0)
            {
                LogError("Failure getting symbol value");
                free(result);
                result = NULL;
            }
            else
            {
                if (string_concat(&result, string_value) != 0)
                {
                    LogError("Failure building amqp value string");
                    free(result);
                    result = NULL;
                }
            }
            break;
        }
        case AMQP_TYPE_LIST:
        {
            uint32_t count;
            if (amqpvalue_get_list_item_count(amqp_value, &count) != 0)
            {
                LogError("Failure getting list item count value");
                free(result);
                result = NULL;
            }
            else if (string_concat(&result, "{") != 0)
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            else
            {
                size_t i;
                for (i = 0; i < count; i++)
                {
                    AMQP_VALUE item = amqpvalue_get_list_item(amqp_value, i);
                    if (item == NULL)
                    {
                        LogError("Failure getting item %u from list", (unsigned int)i);
                        break;
                    }
                    else
                    {
                        char* item_string = amqpvalue_to_string(item);
                        if (item_string == NULL)
                        {
                            LogError("Failure converting item %u to string", (unsigned int)i);
                            amqpvalue_destroy(item);
                            break;
                        }
                        else
                        {
                            if (((i > 0) && (string_concat(&result, ",") != 0)) ||
                                 (string_concat(&result, item_string) != 0))
                            {
                                LogError("Failure building amqp value string");
                                free(result);
                                result = NULL;
                                break;
                            }

                            free(item_string);
                        }

                        amqpvalue_destroy(item);
                    }
                }

                if (i < count)
                {
                    // no log here, we already logged the error
                    free(result);
                    result = NULL;
                }
                else if (string_concat(&result, "}") != 0)
                {
                    LogError("Failure building amqp value string");
                    free(result);
                    result = NULL;
                }
            }
            break;
        }
        case AMQP_TYPE_MAP:
        {
            uint32_t count;
            if (amqpvalue_get_map_pair_count(amqp_value, &count) != 0)
            {
                LogError("Failure getting map pair count");
                free(result);
                result = NULL;
            }
            else if (string_concat(&result, "{") != 0)
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            else
            {
                uint32_t i;
                for (i = 0; i < count; i++)
                {
                    AMQP_VALUE key;
                    AMQP_VALUE value;
                    if (amqpvalue_get_map_key_value_pair(amqp_value, i, &key, &value) != 0)
                    {
                        LogError("Failure getting key/value pair index %u", (unsigned int)i);
                        break;
                    }
                    else
                    {
                        char* key_string = amqpvalue_to_string(key);
                        if (key_string == NULL)
                        {
                            LogError("Failure getting stringified key value for index %u", (unsigned int)i);
                            amqpvalue_destroy(key);
                            amqpvalue_destroy(value);
                            break;
                        }
                        else
                        {
                            char* value_string = amqpvalue_to_string(value);
                            if (value_string == NULL)
                            {
                                LogError("Failure getting stringified value for index %u", (unsigned int)i);
                                free(key_string);
                                amqpvalue_destroy(key);
                                amqpvalue_destroy(value);
                                break;
                            }
                            else
                            {
                                if (((i > 0) && (string_concat(&result, ",") != 0)) ||
                                    (string_concat(&result, "[") != 0) ||
                                    (string_concat(&result, key_string) != 0) ||
                                    (string_concat(&result, ":") != 0) ||
                                    (string_concat(&result, value_string) != 0) ||
                                    (string_concat(&result, "]") != 0))
                                {
                                    LogError("Failure building amqp value string");
                                    free(key_string);
                                    free(value_string);
                                    amqpvalue_destroy(key);
                                    amqpvalue_destroy(value);
                                    break;
                                }

                                free(value_string);
                            }

                            free(key_string);
                        }

                        amqpvalue_destroy(key);
                        amqpvalue_destroy(value);
                    }
                }

                if (i < count)
                {
                    // no log here, we already logged the error
                    free(result);
                    result = NULL;
                }
                else if (string_concat(&result, "}") != 0)
                {
                    LogError("Failure building amqp value string");
                    free(result);
                    result = NULL;
                }
            }
            break;
        }
        case AMQP_TYPE_ARRAY:
        {
            uint32_t count;
            if (amqpvalue_get_array_item_count(amqp_value, &count) != 0)
            {
                LogError("Failure getting array item count");
                free(result);
                result = NULL;
            }
            else if (string_concat(&result, "{") != 0)
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            else
            {
                uint32_t i;
                for (i = 0; i < count; i++)
                {
                    AMQP_VALUE item = amqpvalue_get_array_item(amqp_value, i);
                    if (item == NULL)
                    {
                        LogError("Failure getting array item for index %u", (unsigned int)i);
                        break;
                    }
                    else
                    {
                        char* item_string = amqpvalue_to_string(item);
                        if (item_string == NULL)
                        {
                            LogError("Failure getting stringified array item value for index %u", (unsigned int)i);
                            amqpvalue_destroy(item);
                            break;
                        }
                        else
                        {
                            if (((i > 0) && (string_concat(&result, ",") != 0)) ||
                                 (string_concat(&result, item_string) != 0))
                            {
                                LogError("Failure building amqp value string");
                                free(result);
                                result = NULL;
                                break;
                            }

                            free(item_string);
                        }

                        amqpvalue_destroy(item);
                    }
                }

                if (i < count)
                {
                    // no log here, we already logged the error
                    free(result);
                    result = NULL;
                }
                else if (string_concat(&result, "}") != 0)
                {
                    LogError("Failure building amqp value string");
                    free(result);
                    result = NULL;
                }
            }
            break;
        }
        case AMQP_TYPE_COMPOSITE:
        case AMQP_TYPE_DESCRIBED:
        {
            AMQP_VALUE described_value = amqpvalue_get_inplace_described_value(amqp_value);
            if (described_value == NULL)
            {
                LogError("Failure getting described value");
                free(result);
                result = NULL;
            }
            else
            {
                if (string_concat(&result, "* ") != 0)
                {
                    LogError("Failure building amqp value string");
                    free(result);
                    result = NULL;
                }
                else
                {
                    char* described_value_string = amqpvalue_to_string(described_value);
                    if (described_value_string == NULL)
                    {
                        LogError("Failure getting stringified described value");
                        free(result);
                        result = NULL;
                    }
                    else
                    {
                        if (string_concat(&result, described_value_string) != 0)
                        {
                            LogError("Failure building amqp value string");
                            free(result);
                            result = NULL;
                        }

                        free(described_value_string);
                    }
                }
            }
            break;
        }
        }
    }

    return result;
}